

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddUtil.c
# Opt level: O0

int cuddZddP(DdManager *zdd,DdNode *f)

{
  st__table *t;
  st__table *table;
  int retval;
  DdNode *f_local;
  DdManager *zdd_local;
  
  t = st__init_table(st__ptrcmp,st__ptrhash);
  if (t == (st__table *)0x0) {
    zdd_local._4_4_ = 0;
  }
  else {
    zdd_local._4_4_ = zp2(zdd,f,t);
    st__free_table(t);
    fputc(10,(FILE *)zdd->out);
  }
  return zdd_local._4_4_;
}

Assistant:

int
cuddZddP(
  DdManager * zdd,
  DdNode * f)
{
    int retval;
    st__table *table = st__init_table( st__ptrcmp, st__ptrhash);

    if (table == NULL) return(0);

    retval = zp2(zdd, f, table);
    st__free_table(table);
    (void) fputc('\n', zdd->out);
    return(retval);

}